

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_model<char*>(Imputer *model,char **out)

{
  bool bVar1;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *this;
  __normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
  *__lhs;
  undefined8 *in_RDI;
  ImputeNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *__range2;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *tree;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  *__range1;
  size_t veclen;
  size_t data_sizets [6];
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  __normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
  local_80;
  reference local_78;
  reference local_70;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_68;
  __normal_iterator<const_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
  local_60;
  undefined8 *local_58;
  size_type local_50;
  char **out_00;
  ImputeNode *node_00;
  
  if (!interrupt_switch) {
    out_00 = (char **)*in_RDI;
    node_00 = (ImputeNode *)in_RDI[1];
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::size((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)(in_RDI + 5));
    std::vector<double,_std::allocator<double>_>::size
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb));
    write_bytes<unsigned_long>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char **)0x672a1e);
    this = (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x672a2f);
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
    write_bytes<int>(in_stack_ffffffffffffff60,(size_t)this,(char **)0x672a58);
    __lhs = (__normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
             *)std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x672a69);
    std::vector<double,_std::allocator<double>_>::size
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
    write_bytes<double>(__lhs,(size_t)this,(char **)0x672a94);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x672aa5);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb));
    write_bytes<int>(__lhs,(size_t)this,(char **)0x672ad0);
    local_58 = in_RDI + 5;
    local_60._M_current =
         (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
         std::
         vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
         ::begin((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                  *)this);
    local_68 = (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
               std::
               vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
               ::end((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                               *)__lhs,(__normal_iterator<const_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                                        *)this), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                 ::operator*(&local_60);
      local_50 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::size(local_70);
      write_bytes<unsigned_long>(__lhs,(size_t)this,(char **)0x672b4c);
      local_78 = local_70;
      local_80._M_current =
           (ImputeNode *)std::vector<ImputeNode,_std::allocator<ImputeNode>_>::begin(this);
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
                                       *)this), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
        ::operator*(&local_80);
        serialize_node<char*>(node_00,out_00);
        __gnu_cxx::
        __normal_iterator<const_ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
        ::operator++(&local_80);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
      ::operator++(&local_60);
    }
  }
  return;
}

Assistant:

void serialize_model(const Imputer &model, otype &out)
{
    if (interrupt_switch) return;

    size_t data_sizets[] = {
        model.ncols_numeric,
        model.ncols_categ,
        model.ncat.size(),
        model.imputer_tree.size(),
        model.col_means.size(),
        model.col_modes.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)6, out);

    write_bytes<int>((void*)model.ncat.data(), model.ncat.size(), out);

    write_bytes<double>((void*)model.col_means.data(), model.col_means.size(), out);

    write_bytes<int>((void*)model.col_modes.data(), model.col_modes.size(), out);

    size_t veclen;
    for (const auto &tree : model.imputer_tree) {
        veclen = tree.size();
        write_bytes<size_t>((void*)&veclen, (size_t)1, out);
        for (const auto &node : tree)
            serialize_node(node, out);
    }
}